

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::ShowMetricsWindow::Funcs::NodeWindow(ImGuiWindow *window,char *label)

{
  ImVec2 *pIVar1;
  float *pfVar2;
  uint uVar3;
  ImGuiColumnsSet *pIVar4;
  bool bVar5;
  char *pcVar6;
  char *label_00;
  char *pcVar7;
  long lVar8;
  ulong uVar9;
  char *pcVar10;
  char *pcVar11;
  char *pcVar12;
  char *pcVar13;
  long lVar14;
  float fVar15;
  float fVar16;
  
  uVar9 = 1;
  if (window->Active == false) {
    uVar9 = (ulong)window->WasActive;
  }
  bVar5 = TreeNode(window,"%s \'%s\', %d @ 0x%p",label,window->Name,uVar9,window);
  if (bVar5) {
    uVar3 = window->Flags;
    NodeDrawList(window,window->DrawList,label_00);
    BulletText("Pos: (%.1f,%.1f), Size: (%.1f,%.1f), SizeContents (%.1f,%.1f)",
               (double)(window->Pos).x,(double)(window->Pos).y,(double)(window->Size).x,
               (double)(window->Size).y,(double)(window->SizeContents).x,
               (double)(window->SizeContents).y);
    pcVar7 = "Child ";
    if ((uVar3 >> 0x18 & 1) == 0) {
      pcVar7 = "";
    }
    pcVar6 = "Tooltip ";
    if ((uVar3 >> 0x19 & 1) == 0) {
      pcVar6 = "";
    }
    pcVar10 = "Popup ";
    if ((uVar3 >> 0x1a & 1) == 0) {
      pcVar10 = "";
    }
    pcVar11 = "Modal ";
    if ((uVar3 >> 0x1b & 1) == 0) {
      pcVar11 = "";
    }
    pcVar12 = "ChildMenu ";
    if ((uVar3 >> 0x1c & 1) == 0) {
      pcVar12 = "";
    }
    pcVar13 = "NoSavedSettings ";
    if ((uVar3 >> 8 & 1) == 0) {
      pcVar13 = "";
    }
    BulletText("Flags: 0x%08X (%s%s%s%s%s%s..)",(ulong)uVar3,pcVar7,pcVar6,pcVar10,pcVar11,pcVar12,
               pcVar13);
    fVar15 = (window->SizeContents).x - ((window->SizeFull).x - (window->ScrollbarSizes).x);
    fVar16 = (window->SizeContents).y - ((window->SizeFull).y - (window->ScrollbarSizes).y);
    BulletText("Scroll: (%.2f/%.2f,%.2f/%.2f)",(double)(window->Scroll).x,
               (double)(float)(~-(uint)(fVar15 <= 0.0) & (uint)fVar15),(double)(window->Scroll).y,
               (double)(float)(~-(uint)(fVar16 <= 0.0) & (uint)fVar16));
    BulletText("Active: %d, WriteAccessed: %d",(ulong)window->Active,(ulong)window->WriteAccessed);
    BulletText("NavLastIds: 0x%08X,0x%08X, NavLayerActiveMask: %X",(ulong)window->NavLastIds[0],
               (ulong)window->NavLastIds[1],(ulong)(uint)(window->DC).NavLayerActiveMask);
    if (window->NavLastChildNavWindow == (ImGuiWindow *)0x0) {
      pcVar7 = "NULL";
    }
    else {
      pcVar7 = window->NavLastChildNavWindow->Name;
    }
    BulletText("NavLastChildNavWindow: %s",pcVar7);
    fVar15 = window->NavRectRel[0].Min.x;
    pIVar1 = &window->NavRectRel[0].Max;
    if ((pIVar1->x <= fVar15 && fVar15 != pIVar1->x) ||
       (fVar16 = window->NavRectRel[0].Min.y, pfVar2 = &window->NavRectRel[0].Max.y,
       *pfVar2 <= fVar16 && fVar16 != *pfVar2)) {
      BulletText("NavRectRel[0]: <None>");
    }
    else {
      BulletText("NavRectRel[0]: (%.1f,%.1f)(%.1f,%.1f)",(double)fVar15,
                 (double)window->NavRectRel[0].Min.y,(double)window->NavRectRel[0].Max.x,
                 (double)window->NavRectRel[0].Max.y);
    }
    if (window->RootWindow != window) {
      NodeWindow(window->RootWindow,"RootWindow");
    }
    if (window->ParentWindow != (ImGuiWindow *)0x0) {
      NodeWindow(window->ParentWindow,"ParentWindow");
    }
    if (0 < (window->DC).ChildWindows.Size) {
      NodeWindows(&(window->DC).ChildWindows,"ChildWindows");
    }
    if (0 < (window->ColumnsStorage).Size) {
      bVar5 = TreeNode("Columns","Columns sets (%d)");
      if (bVar5) {
        if (0 < (window->ColumnsStorage).Size) {
          lVar8 = 0;
          do {
            pIVar4 = (window->ColumnsStorage).Data;
            bVar5 = TreeNode((void *)(ulong)pIVar4[lVar8].ID,
                             "Columns Id: 0x%08X, Count: %d, Flags: 0x%04X",
                             (void *)(ulong)pIVar4[lVar8].ID,(ulong)(uint)pIVar4[lVar8].Count,
                             (ulong)(uint)pIVar4[lVar8].Flags);
            if (bVar5) {
              BulletText("Width: %.1f (MinX: %.1f, MaxX: %.1f)",
                         (double)(pIVar4[lVar8].MaxX - pIVar4[lVar8].MinX),
                         (double)pIVar4[lVar8].MinX,(double)pIVar4[lVar8].MaxX);
              if (0 < pIVar4[lVar8].Columns.Size) {
                lVar14 = 0;
                uVar9 = 0;
                do {
                  fVar15 = *(float *)((long)&(pIVar4[lVar8].Columns.Data)->OffsetNorm + lVar14);
                  BulletText("Column %02d: OffsetNorm %.3f (= %.1f px)",(double)fVar15,
                             (double)((pIVar4[lVar8].MaxX - pIVar4[lVar8].MinX) * fVar15),
                             uVar9 & 0xffffffff);
                  uVar9 = uVar9 + 1;
                  lVar14 = lVar14 + 0x1c;
                } while ((long)uVar9 < (long)pIVar4[lVar8].Columns.Size);
              }
              TreePop();
            }
            lVar8 = lVar8 + 1;
          } while (lVar8 < (window->ColumnsStorage).Size);
        }
        TreePop();
      }
    }
    BulletText("Storage: %d bytes",(ulong)(uint)((window->StateStorage).Data.Size << 4));
    TreePop();
    return;
  }
  return;
}

Assistant:

static void NodeWindow(ImGuiWindow* window, const char* label)
            {
                if (!ImGui::TreeNode(window, "%s '%s', %d @ 0x%p", label, window->Name, window->Active || window->WasActive, window))
                    return;
                ImGuiWindowFlags flags = window->Flags;
                NodeDrawList(window, window->DrawList, "DrawList");
                ImGui::BulletText("Pos: (%.1f,%.1f), Size: (%.1f,%.1f), SizeContents (%.1f,%.1f)", window->Pos.x, window->Pos.y, window->Size.x, window->Size.y, window->SizeContents.x, window->SizeContents.y);
                ImGui::BulletText("Flags: 0x%08X (%s%s%s%s%s%s..)", flags,
                    (flags & ImGuiWindowFlags_ChildWindow) ? "Child " : "", (flags & ImGuiWindowFlags_Tooltip)   ? "Tooltip "   : "", (flags & ImGuiWindowFlags_Popup) ? "Popup " : "",
                    (flags & ImGuiWindowFlags_Modal)       ? "Modal " : "", (flags & ImGuiWindowFlags_ChildMenu) ? "ChildMenu " : "", (flags & ImGuiWindowFlags_NoSavedSettings) ? "NoSavedSettings " : "");
                ImGui::BulletText("Scroll: (%.2f/%.2f,%.2f/%.2f)", window->Scroll.x, GetScrollMaxX(window), window->Scroll.y, GetScrollMaxY(window));
                ImGui::BulletText("Active: %d, WriteAccessed: %d", window->Active, window->WriteAccessed);
                ImGui::BulletText("NavLastIds: 0x%08X,0x%08X, NavLayerActiveMask: %X", window->NavLastIds[0], window->NavLastIds[1], window->DC.NavLayerActiveMask);
                ImGui::BulletText("NavLastChildNavWindow: %s", window->NavLastChildNavWindow ? window->NavLastChildNavWindow->Name : "NULL");
                if (!window->NavRectRel[0].IsInverted())
                    ImGui::BulletText("NavRectRel[0]: (%.1f,%.1f)(%.1f,%.1f)", window->NavRectRel[0].Min.x, window->NavRectRel[0].Min.y, window->NavRectRel[0].Max.x, window->NavRectRel[0].Max.y);
                else
                    ImGui::BulletText("NavRectRel[0]: <None>");
                if (window->RootWindow != window) NodeWindow(window->RootWindow, "RootWindow");
                if (window->ParentWindow != NULL) NodeWindow(window->ParentWindow, "ParentWindow");
                if (window->DC.ChildWindows.Size > 0) NodeWindows(window->DC.ChildWindows, "ChildWindows");
                if (window->ColumnsStorage.Size > 0 && ImGui::TreeNode("Columns", "Columns sets (%d)", window->ColumnsStorage.Size))
                {
                    for (int n = 0; n < window->ColumnsStorage.Size; n++)
                    {
                        const ImGuiColumnsSet* columns = &window->ColumnsStorage[n];
                        if (ImGui::TreeNode((void*)(uintptr_t)columns->ID, "Columns Id: 0x%08X, Count: %d, Flags: 0x%04X", columns->ID, columns->Count, columns->Flags))
                        {
                            ImGui::BulletText("Width: %.1f (MinX: %.1f, MaxX: %.1f)", columns->MaxX - columns->MinX, columns->MinX, columns->MaxX);
                            for (int column_n = 0; column_n < columns->Columns.Size; column_n++)
                                ImGui::BulletText("Column %02d: OffsetNorm %.3f (= %.1f px)", column_n, columns->Columns[column_n].OffsetNorm, OffsetNormToPixels(columns, columns->Columns[column_n].OffsetNorm));
                            ImGui::TreePop();
                        }
                    }
                    ImGui::TreePop();
                }
                ImGui::BulletText("Storage: %d bytes", window->StateStorage.Data.Size * (int)sizeof(ImGuiStorage::Pair));
                ImGui::TreePop();
            }